

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

void __thiscall duckdb::RenameColumnInfo::~RenameColumnInfo(RenameColumnInfo *this)

{
  ~RenameColumnInfo(this);
  operator_delete(this);
  return;
}

Assistant:

RenameColumnInfo::~RenameColumnInfo() {
}